

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O1

void __thiscall
NewClassExpression::AddElement
          (NewClassExpression *this,ExpressionPtr *key,ExpressionPtr *value,
          ExpressionPtr *attributes,bool isStatic)

{
  ClassElement element;
  value_type local_68;
  
  local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (attributes->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(attributes->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_68.isStatic = isStatic;
  std::vector<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>::
  push_back(&this->m_Elements,&local_68);
  if (local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void AddElement( ExpressionPtr key, ExpressionPtr value, ExpressionPtr attributes, bool isStatic )
	{
		ClassElement element;
		element.key = key;
		element.value = value;
		element.attributes = attributes;
		element.isStatic = isStatic;

		m_Elements.push_back(element);
	}